

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O2

void save_json(path *root,string_view filename,json *dbjson)

{
  ostream *poVar1;
  string_view filename_local;
  string tmp_db_name;
  path local_2d8;
  path local_298;
  path local_258;
  ofstream db_file;
  undefined8 auStack_208 [62];
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  random_hex_string_abi_cxx11_(&local_258._M_pathname,8);
  std::operator+(&local_2d8._M_pathname,"upgrade.",&local_258._M_pathname);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_298,&local_2d8._M_pathname);
  std::experimental::filesystem::v1::__cxx11::operator/((path *)&db_file,root,&local_298);
  std::__cxx11::string::string((string *)&tmp_db_name,(string *)&db_file);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&db_file);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_298);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_258);
  std::ofstream::ofstream(&db_file);
  std::ios::exceptions((int)&db_file + (int)*(undefined8 *)(_db_file + -0x18));
  std::ofstream::open((string *)&db_file,(_Ios_Openmode)&tmp_db_name);
  *(undefined8 *)((long)auStack_208 + *(long *)(_db_file + -0x18)) = 4;
  poVar1 = nlohmann::operator<<((ostream *)&db_file,dbjson);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  std::ofstream::close();
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (&local_298,&tmp_db_name);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_258,&filename_local);
  std::experimental::filesystem::v1::__cxx11::operator/(&local_2d8,root,&local_258);
  std::experimental::filesystem::v1::rename(&local_298,&local_2d8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2d8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_258);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_298);
  std::ofstream::~ofstream(&db_file);
  std::__cxx11::string::~string((string *)&tmp_db_name);
  return;
}

Assistant:

void save_json(const fs::path &root, std::string_view filename,
               const json &dbjson) {
    std::string tmp_db_name = root / ("upgrade." + random_hex_string(8));
    std::ofstream db_file;
    db_file.exceptions(std::ofstream::badbit);
    db_file.open(tmp_db_name, std::ofstream::binary);
    db_file << std::setw(4) << dbjson << std::endl;
    db_file.flush();
    db_file.close();
    fs::rename(tmp_db_name, root / filename);
}